

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O0

double __thiscall HeuristicNeighbourhood::getFixingRate(HeuristicNeighbourhood *this)

{
  size_type __n;
  HighsVarType HVar1;
  bool bVar2;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *pvVar3;
  HighsDomain *pHVar4;
  const_reference pvVar5;
  i64 iVar6;
  undefined8 *in_RDI;
  double dVar7;
  HighsInt col;
  int *in_stack_00000030;
  HighsHashTable<int,_void> *in_stack_00000038;
  undefined8 in_stack_ffffffffffffffd8;
  HighsDomain *this_00;
  undefined4 in_stack_fffffffffffffff0;
  HighsInt HVar8;
  
  while( true ) {
    this_00 = (HighsDomain *)in_RDI[8];
    pvVar3 = HighsDomain::getDomainChangeStack((HighsDomain *)*in_RDI);
    pHVar4 = (HighsDomain *)
             std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(pvVar3);
    if (pHVar4 <= this_00) break;
    pvVar3 = HighsDomain::getDomainChangeStack((HighsDomain *)*in_RDI);
    __n = in_RDI[8];
    in_RDI[8] = __n + 1;
    pvVar5 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (pvVar3,__n);
    HVar8 = pvVar5->column;
    HVar1 = HighsDomain::variableType(this_00,(HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    if ((HVar1 != kContinuous) &&
       (bVar2 = HighsDomain::isFixed
                          ((HighsDomain *)CONCAT44(HVar8,in_stack_fffffffffffffff0),
                           (HighsInt)((ulong)in_RDI >> 0x20)), bVar2)) {
      HighsHashTable<int,void>::insert<int&>(in_stack_00000038,in_stack_00000030);
    }
  }
  if (*(int *)(in_RDI + 9) == 0) {
    dVar7 = 0.0;
  }
  else {
    iVar6 = HighsHashTable<int,_void>::size((HighsHashTable<int,_void> *)(in_RDI + 2));
    dVar7 = (double)iVar6 / (double)*(int *)(in_RDI + 9);
  }
  return dVar7;
}

Assistant:

double getFixingRate() {
    while (nCheckedChanges < localdom.getDomainChangeStack().size()) {
      HighsInt col = localdom.getDomainChangeStack()[nCheckedChanges++].column;
      if (localdom.variableType(col) == HighsVarType::kContinuous) continue;
      if (localdom.isFixed(col)) fixedCols.insert(col);
    }

    return numTotal ? static_cast<double>(fixedCols.size()) /
                          static_cast<double>(numTotal)
                    : 0.0;
  }